

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

_Bool build_nest(chunk_conflict *c,loc centre,wchar_t rating)

{
  int iVar1;
  monster_group_info group_info;
  loc_conflict grid_00;
  loc grid_01;
  bool bVar2;
  int iVar3;
  _Bool _Var4;
  uint32_t uVar5;
  wchar_t wVar6;
  wchar_t y2_00;
  wchar_t x1_00;
  wchar_t x2_00;
  monster_race *pmVar7;
  monster_race *race;
  monster_group_info info;
  wchar_t width;
  wchar_t height;
  wchar_t size_vary;
  wchar_t light;
  _Bool empty;
  monster_race *what [64];
  int local_40;
  wchar_t alloc_obj;
  wchar_t i;
  wchar_t x2;
  wchar_t y2;
  wchar_t x1;
  wchar_t y1;
  loc grid;
  wchar_t rating_local;
  chunk_conflict *c_local;
  int iStack_10;
  loc centre_local;
  
  bVar2 = false;
  unique0x100003ec = centre;
  uVar5 = Rand_div(4);
  info.player_race._4_4_ = uVar5 * 2 + 0xb;
  memset(&race,0,0x10);
  event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,L'\v',info.player_race._4_4_ + L'\x02');
  if (((iStack_10 < c->height) && (c_local._4_4_ < c->width)) ||
     (_Var4 = find_space((loc *)((long)&c_local + 4),L'\v',info.player_race._4_4_ + L'\x02'), _Var4)
     ) {
    iVar3 = iStack_10;
    wVar6 = iStack_10 + L'\xfffffffc';
    y2_00 = iStack_10 + L'\x04';
    x1_00 = c_local._4_4_ - info.player_race._4_4_ / 2;
    x2_00 = c_local._4_4_ + info.player_race._4_4_ / 2;
    generate_room(c,iStack_10 + L'\xfffffffb',x1_00 + L'\xffffffff',iStack_10 + L'\x05',
                  x2_00 + L'\x01',L'\0');
    draw_rectangle(c,iVar3 + L'\xfffffffb',x1_00 + L'\xffffffff',iVar3 + L'\x05',x2_00 + L'\x01',
                   FEAT_GRANITE,L'\f',false);
    fill_rectangle(c,wVar6,x1_00,y2_00,x2_00,FEAT_FLOOR,L'\0');
    y1 = iVar3 + L'\xfffffffe';
    draw_rectangle(c,iVar3 + L'\xfffffffd',x1_00 + L'\x01',iVar3 + L'\x03',x2_00 + L'\xffffffff',
                   FEAT_GRANITE,L'\v',false);
    generate_hole(c,iVar3 + L'\xfffffffd',x1_00 + L'\x01',iVar3 + L'\x03',x2_00 + L'\xffffffff',
                  FEAT_CLOSED);
    set_pit_type(c->depth,L'\x02');
    event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,dun->pit_type->name);
    what[0x3f]._4_4_ = dun->pit_type->obj_rarity;
    get_mon_num_prep(mon_pit_hook);
    for (local_40 = 0; local_40 < 0x40; local_40 = local_40 + 1) {
      pmVar7 = get_mon_num(c->depth + L'\n',c->depth);
      *(monster_race **)(&light + (long)local_40 * 2) = pmVar7;
      if (*(long *)(&light + (long)local_40 * 2) == 0) {
        bVar2 = true;
      }
    }
    get_mon_num_prep((_func__Bool_monster_race_ptr *)0x0);
    if (bVar2) {
      centre_local.x._3_1_ = false;
    }
    else {
      if (((player->opts).opt[0x18] & 1U) != 0) {
        msg("Monster nest (%s)",dun->pit_type->name);
      }
      add_to_monster_rating((chunk *)c,uVar5 + dun->pit_type->ave / 0x14);
      for (; x1 = x1_00 + L'\x02', y1 <= iVar3 + L'\x02'; y1 = y1 + L'\x01') {
        for (; x1 <= x2_00 + L'\xfffffffe'; x1 = x1 + L'\x01') {
          uVar5 = Rand_div(0x40);
          grid_00.y = y1;
          grid_00.x = x1;
          group_info.player_race._0_4_ = info.index;
          group_info._0_8_ = race;
          group_info.player_race._4_4_ = info.role;
          place_new_monster((chunk *)c,grid_00,*(monster_race **)(&light + (long)(int)uVar5 * 2),
                            false,false,group_info,'\f');
          wVar6 = Rand_div(100);
          if (wVar6 < what[0x3f]._4_4_) {
            iVar1 = c->depth;
            uVar5 = Rand_div(3);
            grid_01.y = y1;
            grid_01.x = x1;
            place_object(c,grid_01,iVar1 + L'\n',(_Bool)((uVar5 != 0 ^ 0xffU) & 1),false,'\x04',
                         L'\0');
          }
        }
      }
      centre_local.x._3_1_ = true;
    }
  }
  else {
    centre_local.x._3_1_ = false;
  }
  return centre_local.x._3_1_;
}

Assistant:

bool build_nest(struct chunk *c, struct loc centre, int rating)
{
	struct loc grid;
	int y1, x1, y2, x2;
	int i;
	int alloc_obj;
	struct monster_race *what[64];
	bool empty = false;
	int light = false;
	int size_vary = randint0(4);
	int height = 9;
	int width = 11 + 2 * size_vary;
	struct monster_group_info info = { 0, 0, 0 };

	/* Find and reserve some space in the dungeon.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE, height + 2, width + 2);
	if ((centre.y >= c->height) || (centre.x >= c->width)) {
		if (!find_space(&centre, height + 2, width + 2))
			return (false);
	}

	/* Large room */
	y1 = centre.y - height / 2;
	y2 = centre.y + height / 2;
	x1 = centre.x - width / 2;
	x2 = centre.x + width / 2;

	/* Generate new room */
	generate_room(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, light);

	/* Generate outer walls */
	draw_rectangle(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_GRANITE,
		SQUARE_WALL_OUTER, false);

	/* Generate inner floors */
	fill_rectangle(c, y1, x1, y2, x2, FEAT_FLOOR, SQUARE_NONE);

	/* Advance to the center room */
	y1 = y1 + 2;
	y2 = y2 - 2;
	x1 = x1 + 2;
	x2 = x2 - 2;

	/* Generate inner walls; add one door as entrance */
	draw_rectangle(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_GRANITE,
		SQUARE_WALL_INNER, false);
	generate_hole(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_CLOSED);

	/* Decide on the pit type */
	set_pit_type(c->depth, 2);
	event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, dun->pit_type->name);

	/* Chance of objects on the floor */
	alloc_obj = dun->pit_type->obj_rarity;
	
	/* Prepare allocation table */
	get_mon_num_prep(mon_pit_hook);

	/* Pick some monster types */
	for (i = 0; i < 64; i++) {
		/* Get a (hard) monster type */
		what[i] = get_mon_num(c->depth + 10, c->depth);

		/* Notice failure */
		if (!what[i]) empty = true;
	}

	/* Prepare allocation table */
	get_mon_num_prep(NULL);

	/* Oops */
	if (empty) return false;

	/* Describe */
	ROOM_LOG("Monster nest (%s)", dun->pit_type->name);

	/* Increase the level rating */
	add_to_monster_rating(c, size_vary + dun->pit_type->ave / 20);

	/* Place some monsters */
	for (grid.y = y1; grid.y <= y2; grid.y++) {
		for (grid.x = x1; grid.x <= x2; grid.x++) {
			/* Figure out what monster is being used, and place that monster */
			struct monster_race *race = what[randint0(64)];
			place_new_monster(c, grid, race, false, false, info,
							  ORIGIN_DROP_PIT);

			/* Occasionally place an item, making it good 1/3 of the time */
			if (randint0(100) < alloc_obj) 
				place_object(c, grid, c->depth + 10, one_in_(3), false,
							 ORIGIN_PIT, 0);
		}
	}

	return true;
}